

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NRooks.cpp
# Opt level: O0

void __thiscall pm::NRooks::shuffleXCoords(NRooks *this)

{
  float fVar1;
  float fVar2;
  uint32_t uVar3;
  uint uVar4;
  reference pvVar5;
  uint uVar6;
  float temp;
  uint target;
  uint source;
  uint i;
  uint p;
  NRooks *this_local;
  
  for (source = 0; source < (this->super_Sampler).numSets_; source = source + 1) {
    for (target = 0; target < (this->super_Sampler).numSamples_ - 1; target = target + 1) {
      uVar6 = target + source * (this->super_Sampler).numSamples_ + 1;
      uVar3 = Random::integer(&(this->super_Sampler).rnd_,0,(this->super_Sampler).numSamples_);
      uVar4 = uVar3 + source * (this->super_Sampler).numSamples_;
      pvVar5 = std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::operator[]
                         (&(this->super_Sampler).samples_,(ulong)uVar6);
      fVar1 = pvVar5->x;
      pvVar5 = std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::operator[]
                         (&(this->super_Sampler).samples_,(ulong)uVar4);
      fVar2 = pvVar5->x;
      pvVar5 = std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::operator[]
                         (&(this->super_Sampler).samples_,(ulong)uVar6);
      pvVar5->x = fVar2;
      pvVar5 = std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::operator[]
                         (&(this->super_Sampler).samples_,(ulong)uVar4);
      pvVar5->x = fVar1;
    }
  }
  return;
}

Assistant:

void NRooks::shuffleXCoords()
{
	for (unsigned int p = 0; p < numSets_; p++)
		for (unsigned int i = 0; i < numSamples_ - 1; i++)
		{
			const int unsigned source = i + p * numSamples_ + 1;
			const int unsigned target = rnd_.integer(0, numSamples_) + p * numSamples_;

			const float temp = samples_[source].x;
			samples_[source].x = samples_[target].x;
			samples_[target].x = temp;
		}
}